

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall
TiXmlNode::InsertBeforeChild(TiXmlNode *this,TiXmlNode *beforeThis,TiXmlNode *addThis)

{
  int iVar1;
  TiXmlDocument *pTVar2;
  undefined4 extraout_var;
  TiXmlNode *node;
  TiXmlNode *addThis_local;
  TiXmlNode *beforeThis_local;
  TiXmlNode *this_local;
  
  if ((beforeThis == (TiXmlNode *)0x0) || (beforeThis->parent != this)) {
    this_local = (TiXmlNode *)0x0;
  }
  else {
    iVar1 = Type(addThis);
    if (iVar1 == 0) {
      pTVar2 = GetDocument(this);
      if (pTVar2 != (TiXmlDocument *)0x0) {
        pTVar2 = GetDocument(this);
        TiXmlDocument::SetError
                  (pTVar2,0xf,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
      }
      this_local = (TiXmlNode *)0x0;
    }
    else {
      iVar1 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])();
      this_local = (TiXmlNode *)CONCAT44(extraout_var,iVar1);
      if (this_local == (TiXmlNode *)0x0) {
        this_local = (TiXmlNode *)0x0;
      }
      else {
        this_local->parent = this;
        this_local->next = beforeThis;
        this_local->prev = beforeThis->prev;
        if (beforeThis->prev == (TiXmlNode *)0x0) {
          if (this->firstChild != beforeThis) {
            __assert_fail("firstChild == beforeThis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                          ,0xff,
                          "TiXmlNode *TiXmlNode::InsertBeforeChild(TiXmlNode *, const TiXmlNode &)")
            ;
          }
          this->firstChild = this_local;
        }
        else {
          beforeThis->prev->next = this_local;
        }
        beforeThis->prev = this_local;
      }
    }
  }
  return this_local;
}

Assistant:

TiXmlNode* TiXmlNode::InsertBeforeChild( TiXmlNode* beforeThis, const TiXmlNode& addThis )
{	
	if ( !beforeThis || beforeThis->parent != this ) {
		return 0;
	}
	if ( addThis.Type() == TiXmlNode::TINYXML_DOCUMENT )
	{
		if ( GetDocument() ) 
			GetDocument()->SetError( TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	TiXmlNode* node = addThis.Clone();
	if ( !node )
		return 0;
	node->parent = this;

	node->next = beforeThis;
	node->prev = beforeThis->prev;
	if ( beforeThis->prev )
	{
		beforeThis->prev->next = node;
	}
	else
	{
		assert( firstChild == beforeThis );
		firstChild = node;
	}
	beforeThis->prev = node;
	return node;
}